

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O3

int_t flexfloat_rounding_value(flexfloat_t *a,int_fast16_t exp,_Bool sign)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  
  if (((ulong)a->value & 0x7ff0000000000000) == 0) {
    lVar5 = 0;
    if (sign) {
      lVar5 = -0x8000000000000000;
    }
    lVar3 = 1L << (0x34 - (a->desc).frac_bits & 0x3f);
  }
  else {
    bVar1 = (a->desc).exp_bits;
    uVar6 = -1L << (bVar1 & 0x3f);
    bVar2 = (a->desc).frac_bits;
    iVar7 = (int)(-1L << (bVar1 - 1 & 0x3f));
    if (exp < 1) {
      lVar5 = ((ulong)(iVar7 - (uint)bVar2) << 0x34) + 0x4010000000000000;
      if ((uVar6 ^ 1 - (ulong)bVar2) == 0xffffffffffffffff) {
        lVar5 = 0x7ff0000000000000;
      }
      lVar3 = 0;
      if (sign) {
        lVar3 = -0x8000000000000000;
      }
      return lVar3 + lVar5;
    }
    uVar4 = exp - (ulong)bVar2;
    lVar5 = ((ulong)((int)uVar4 + iVar7 + 1) << 0x34) + 0x3ff0000000000000;
    if ((uVar6 ^ uVar4) == 0xffffffffffffffff) {
      lVar5 = 0x7ff0000000000000;
    }
    lVar3 = 0;
    if (sign) {
      lVar3 = -0x8000000000000000;
    }
  }
  return lVar3 + lVar5;
}

Assistant:

int_t flexfloat_rounding_value(const flexfloat_t *a, int_fast16_t exp, bool sign)
{
    if(EXPONENT(CAST_TO_INT(a->value)) == 0) // Denorm backend format
    {
        return flexfloat_denorm_pack(a->desc, sign, 0x1);
    }
    else if(exp <= 0) // Denorm target format
    {
        return flexfloat_pack(a->desc, sign, - a->desc.frac_bits + 1 , 0);
    }
    else
    {
        return flexfloat_pack(a->desc, sign, exp - a->desc.frac_bits , 0);
    }

}